

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O0

size_t lzma_block_buffer_bound(size_t uncompressed_size)

{
  uint64_t uVar1;
  uint64_t ret;
  size_t uncompressed_size_local;
  
  uVar1 = lzma_block_buffer_bound64(uncompressed_size);
  return uVar1;
}

Assistant:

extern LZMA_API(size_t)
lzma_block_buffer_bound(size_t uncompressed_size)
{
	uint64_t ret = lzma_block_buffer_bound64(uncompressed_size);

#if SIZE_MAX < UINT64_MAX
	// Catch the possible integer overflow on 32-bit systems.
	if (ret > SIZE_MAX)
		return 0;
#endif

	return ret;
}